

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
detail::writer::operator()
          (writer *this,vector<example::option_t,_std::allocator<example::option_t>_> *vals)

{
  vector<example::option_t,_std::allocator<example::option_t>_> *this_00;
  bool bVar1;
  size_type sVar2;
  reference val_00;
  option_t *val;
  const_iterator __end0;
  const_iterator __begin0;
  vector<example::option_t,_std::allocator<example::option_t>_> *__range2;
  vector<example::option_t,_std::allocator<example::option_t>_> *local_18;
  vector<example::option_t,_std::allocator<example::option_t>_> *vals_local;
  writer *this_local;
  
  local_18 = vals;
  vals_local = (vector<example::option_t,_std::allocator<example::option_t>_> *)this;
  sVar2 = std::vector<example::option_t,_std::allocator<example::option_t>_>::size(vals);
  __range2._6_2_ = (undefined2)sVar2;
  operator()(this,(unsigned_short *)((long)&__range2 + 6));
  this_00 = local_18;
  __end0 = std::vector<example::option_t,_std::allocator<example::option_t>_>::begin(local_18);
  val = (option_t *)std::vector<example::option_t,_std::allocator<example::option_t>_>::end(this_00)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_example::option_t_*,_std::vector<example::option_t,_std::allocator<example::option_t>_>_>
                                *)&val);
    if (!bVar1) break;
    val_00 = __gnu_cxx::
             __normal_iterator<const_example::option_t_*,_std::vector<example::option_t,_std::allocator<example::option_t>_>_>
             ::operator*(&__end0);
    operator()(this,val_00);
    __gnu_cxx::
    __normal_iterator<const_example::option_t_*,_std::vector<example::option_t,_std::allocator<example::option_t>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void operator()(std::vector<T> const& vals) const {
        (*this)(static_cast<uint16_t>(vals.size()));
        for (auto&& val : vals)
            (*this)(val);
    }